

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O0

int QuiescentSearch(Situation *situation,int alpha,int beta)

{
  bool bVar1;
  int beta_00;
  int iVar2;
  int in_EDX;
  int in_ESI;
  int i;
  int move_num;
  Movement move_list [64];
  Movement move;
  int best;
  int value;
  int *in_stack_fffffffffffffcb8;
  uint in_stack_fffffffffffffcc0;
  int iVar3;
  int in_stack_fffffffffffffcc4;
  int iVar4;
  Situation *in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffcff;
  Movement *in_stack_fffffffffffffd00;
  Situation *in_stack_fffffffffffffd08;
  Situation *in_stack_fffffffffffffd10;
  int iStack_28;
  int local_4;
  
  beta_00 = step + -10000;
  local_4 = in_EDX;
  if ((beta_00 < in_EDX) &&
     (iVar2 = Evaluate(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0
                      ), local_4 = in_EDX, iVar2 <= in_EDX)) {
    local_4 = in_ESI;
    if (in_ESI < iVar2) {
      local_4 = iVar2;
    }
    iVar4 = 0;
    CaptureMoveSort((Situation *)(ulong)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                    (Movement *)0x1137f4);
    iVar3 = 0;
    while ((iVar3 < iVar4 &&
           (iStack_28 = (int)((ulong)*(undefined8 *)(&stack0xfffffffffffffcc8 + (long)iVar3 * 0xc)
                             >> 0x20), iStack_28 != 0))) {
      bVar1 = MakeAMove(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                        (bool)in_stack_fffffffffffffcff);
      if (bVar1) {
        iVar2 = step + -10000;
      }
      else {
        iVar2 = QuiescentSearch((Situation *)CONCAT44(local_4,in_EDX),iVar2,beta_00);
        iVar2 = -iVar2;
      }
      UnMakeAMove(in_stack_fffffffffffffd10);
      if (in_EDX <= iVar2) {
        return in_EDX;
      }
      if ((beta_00 < iVar2) && (beta_00 = iVar2, local_4 < iVar2)) {
        local_4 = iVar2;
      }
      iVar3 = iVar3 + 1;
    }
  }
  return local_4;
}

Assistant:

int QuiescentSearch(Situation& situation, int alpha, int beta){
    int value;                  // 下一着法的分值
    int best;                   // 所有着法中的最佳分值
    Movement move;              // 当前着法
    Movement move_list[64];     // 当前所有着法

    best = step - MAX_VALUE;
    // 必输局面直接返回
    if(best >= beta){
        return beta;
    }
    
    // 调用评估函数进行评估
    value = Evaluate(situation, alpha, beta);
    if(value > beta)
        return beta;
    if(value > alpha)
        alpha = value;
    
    int move_num = 0;       // 着法数量
    // 生成所有吃子着法
    CaptureMoveSort(situation, move_num, move_list);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.value == 0) break;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            value = -QuiescentSearch(situation, -beta, -alpha);
        }
        // 回溯
        UnMakeAMove(situation);
        if(value >= beta){
            return beta;
        }
        if(value > best){
            best = value;
            if(value > alpha){
                alpha = value;
            }
        }
    }
    return alpha;
}